

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O0

void reduce_min<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  code *pcVar1;
  double dVar2;
  ulong uVar3;
  bool bVar4;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  int iVar5;
  size_type sVar6;
  undefined1 *__stat_loc;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  Expression_lhs<const_int_&> EVar7;
  ResultBuilder DOCTEST_RB_2;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  Task ptask;
  Task stask;
  iterator end;
  iterator beg;
  int pmin;
  int smin;
  size_t c;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<int> *__range2;
  size_t n;
  int *i;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> vec;
  Taskflow taskflow;
  Executor executor;
  Result *in_stack_fffffffffffff9c8;
  Task *tasks;
  Result *pRVar8;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  Executor *this;
  allocator_type *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  Enum in_stack_fffffffffffff9ec;
  Taskflow *in_stack_fffffffffffff9f0;
  Executor *in_stack_fffffffffffffa00;
  anon_class_40_5_697928ac *in_stack_fffffffffffffa10;
  FlowBuilder *in_stack_fffffffffffffa18;
  Taskflow *in_stack_fffffffffffffa50;
  Enum in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa5c;
  ExpressionDecomposer local_59c;
  Taskflow *local_598;
  Enum local_590;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffab8;
  size_t in_stack_fffffffffffffac0;
  undefined8 in_stack_fffffffffffffac8;
  ExpressionDecomposer local_4d4;
  Executor *local_4d0;
  Enum local_4c8;
  ResultBuilder local_4a0;
  int local_424;
  anon_class_40_5_697928ac *local_420;
  Enum local_418;
  ExpressionDecomposer local_40c;
  anon_class_40_5_697928ac *local_408;
  Enum local_400;
  ResultBuilder local_3d8;
  __basic_future<void> local_360 [2];
  undefined4 local_340;
  undefined4 uStack_33c;
  undefined4 uStack_338;
  undefined4 uStack_334;
  Executor *local_330;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_320;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_318;
  FlowBuilder local_310;
  FlowBuilder local_308;
  int **local_300;
  vector<int,_std::allocator<int>_> *local_2f8;
  int **local_2f0;
  ulong *local_2e8;
  int *local_2e0;
  int *local_2d0;
  int *local_2c8;
  int local_2c0;
  int local_2bc;
  long local_2b8;
  int *local_2b0;
  int *local_2a8;
  int local_29c [5];
  initializer_list<int> local_288;
  initializer_list<int> *local_278;
  ulong local_270;
  reference local_268;
  int *local_260;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_258;
  vector<int,_std::allocator<int>_> *local_250;
  vector<int,_std::allocator<int>_> local_240;
  undefined1 local_228 [232];
  undefined1 local_140 [320];
  
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),in_stack_fffffffffffff9c8
            );
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
             in_stack_fffffffffffffab8);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x16a4cc);
  tf::Taskflow::Taskflow(in_stack_fffffffffffff9f0);
  std::allocator<int>::allocator((allocator<int> *)0x16a4ed);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9f0,
             CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),in_stack_fffffffffffff9e0
            );
  std::allocator<int>::~allocator((allocator<int> *)0x16a513);
  local_250 = &local_240;
  local_258._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c8);
  local_260 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c8);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffff9c8);
    if (!bVar4) break;
    local_268 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_258);
    iVar5 = rand();
    *local_268 = iVar5 % 100 + -0x32;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_258);
  }
  local_270 = 1;
  do {
    uVar3 = local_270;
    sVar6 = std::vector<int,_std::allocator<int>_>::size(&local_240);
    if (sVar6 <= uVar3) {
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9e0);
      tf::Taskflow::~Taskflow
                ((Taskflow *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      tf::Executor::~Executor(in_stack_fffffffffffffa00);
      return;
    }
    local_29c[0] = 0;
    local_29c[1] = 1;
    local_29c[2] = 3;
    local_29c[3] = 7;
    local_29c[4] = 99;
    local_288._M_array = local_29c;
    local_288._M_len = 5;
    local_278 = &local_288;
    local_2a8 = std::initializer_list<int>::begin(local_278);
    local_2b0 = std::initializer_list<int>::end
                          ((initializer_list<int> *)
                           CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
    for (; local_2a8 != local_2b0; local_2a8 = local_2a8 + 1) {
      local_2b8 = (long)*local_2a8;
      local_2bc = std::numeric_limits<int>::max();
      local_2c0 = std::numeric_limits<int>::max();
      local_2c8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c8);
      local_2d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c8);
      tf::Taskflow::clear((Taskflow *)0x16a745);
      local_300 = &local_2c8;
      local_2f0 = &local_2d0;
      local_2e8 = &local_270;
      local_2e0 = &local_2bc;
      local_2f8 = &local_240;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:62:37),_nullptr>
                (in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
      tf::Task::Task((Task *)&local_308);
      local_318 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                  std::ref<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff9c8);
      local_320 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                  std::ref<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff9c8);
      tf::RandomPartitioner<tf::DefaultClosureWrapper>::RandomPartitioner
                ((RandomPartitioner<tf::DefaultClosureWrapper> *)
                 CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                 (size_t)in_stack_fffffffffffff9c8);
      tasks = (Task *)CONCAT44(uStack_33c,local_340);
      in_stack_fffffffffffff9d0 = uStack_338;
      in_stack_fffffffffffff9d4 = uStack_334;
      this = local_330;
      tf::FlowBuilder::
      reduce<std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,int,reduce_min<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(int&,int&)_1_,tf::RandomPartitioner<tf::DefaultClosureWrapper>>
                (&local_310,local_228,local_318,local_320,&local_2c0);
      in_stack_fffffffffffffa18 = &local_308;
      tf::Task::operator=((Task *)in_stack_fffffffffffffa18,(Task *)&local_310);
      tf::Task::precede<tf::Task&>
                ((Task *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),tasks);
      __stat_loc = local_140;
      tf::Executor::run(this,(Taskflow *)
                             CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      iVar5 = (int)((ulong)this >> 0x20);
      std::__basic_future<void>::wait(local_360,__stat_loc);
      tf::Future<void>::~Future
                ((Future<void> *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      pRVar8 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                ((ResultBuilder *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 (char *)in_stack_fffffffffffff9e0,iVar5,
                 (char *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),"",
                 (char *)in_stack_fffffffffffffa00);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_40c,DT_REQUIRE);
      EVar7 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),(int *)pRVar8
                        );
      in_stack_fffffffffffffa10 = (anon_class_40_5_697928ac *)EVar7.lhs;
      local_418 = EVar7.m_at;
      local_420 = in_stack_fffffffffffffa10;
      local_408 = in_stack_fffffffffffffa10;
      local_400 = local_418;
      local_424 = std::numeric_limits<int>::max();
      doctest::detail::Expression_lhs<int_const&>::operator!=
                ((Expression_lhs<const_int_&> *)
                 CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                 (int *)in_stack_fffffffffffffa50);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                 pRVar8);
      doctest::detail::Result::~Result((Result *)0x16a99b);
      dVar2 = doctest::detail::ResultBuilder::log
                        (&local_3d8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if ((extraout_AL & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x16aab0);
      pRVar8 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                ((ResultBuilder *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 (char *)in_stack_fffffffffffff9e0,iVar5,
                 (char *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),"",
                 (char *)in_stack_fffffffffffffa00);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4d4,DT_REQUIRE);
      EVar7 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),(int *)pRVar8
                        );
      in_stack_fffffffffffffa00 = (Executor *)EVar7.lhs;
      local_4c8 = EVar7.m_at;
      local_4d0 = in_stack_fffffffffffffa00;
      std::numeric_limits<int>::max();
      doctest::detail::Expression_lhs<int_const&>::operator!=
                ((Expression_lhs<const_int_&> *)
                 CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                 (int *)in_stack_fffffffffffffa50);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                 pRVar8);
      doctest::detail::Result::~Result((Result *)0x16aba1);
      dVar2 = doctest::detail::ResultBuilder::log
                        (&local_4a0,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      if ((extraout_AL_00 & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x16ac86);
      in_stack_fffffffffffff9c8 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                ((ResultBuilder *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 (char *)in_stack_fffffffffffff9e0,iVar5,
                 (char *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),"",
                 (char *)in_stack_fffffffffffffa00);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_59c,DT_REQUIRE);
      EVar7 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                         (int *)in_stack_fffffffffffff9c8);
      in_stack_fffffffffffff9f0 = (Taskflow *)EVar7.lhs;
      in_stack_fffffffffffff9ec = EVar7.m_at;
      in_stack_fffffffffffffa50 = in_stack_fffffffffffff9f0;
      in_stack_fffffffffffffa58 = in_stack_fffffffffffff9ec;
      local_598 = in_stack_fffffffffffff9f0;
      local_590 = in_stack_fffffffffffff9ec;
      doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                ((Expression_lhs<const_int_&> *)
                 CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffff9ec),
                 (int *)in_stack_fffffffffffff9f0);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                 in_stack_fffffffffffff9c8);
      doctest::detail::Result::~Result((Result *)0x16ad6b);
      dVar2 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&stack0xfffffffffffffa98,
                         (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if ((extraout_AL_01 & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x16ae4a);
    }
    local_270 = local_270 + 1;
  } while( true );
}

Assistant:

void reduce_min(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<int> vec(1000);

  for(auto& i : vec) i = ::rand() % 100 - 50;

  for(size_t n=1; n<vec.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      int smin = std::numeric_limits<int>::max();
      int pmin = std::numeric_limits<int>::max();
      auto beg = vec.end();
      auto end = vec.end();

      taskflow.clear();
      auto stask = taskflow.emplace([&](){
        beg = vec.begin();
        end = vec.begin() + n;
        for(auto itr = beg; itr != end; itr++) {
          smin = std::min(*itr, smin);
        }
      });

      tf::Task ptask;

      ptask = taskflow.reduce(
        std::ref(beg), std::ref(end), pmin, [](int& l, int& r){
        return std::min(l, r);
      }, P(c));

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(smin != std::numeric_limits<int>::max());
      REQUIRE(pmin != std::numeric_limits<int>::max());
      REQUIRE(smin == pmin);
    }
  }
}